

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O3

void do_weighting<sparse_parameters>
               (vw *all,uint64_t length,float *param_3,sparse_parameters *weights)

{
  float *pfVar1;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var2;
  uint64_t uVar3;
  float fVar4;
  uint64_t index;
  ulong local_48;
  ulong local_40;
  float *local_38;
  
  if (length != 0) {
    uVar3 = 0;
    do {
      local_48 = uVar3 << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask;
      _Var2._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_48);
      if (_Var2._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_48;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights,&local_40);
        _Var2._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_48);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var2._M_cur + 0x10),weights->default_data);
        }
      }
      pfVar1 = *(float **)
                ((long)&((_Var2._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                        super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                        _M_storage._M_storage + 8);
      if (param_3[uVar3] <= 0.0) {
        param_3[uVar3] = 0.0;
        *pfVar1 = 0.0;
      }
      else {
        fVar4 = pfVar1[1] / param_3[uVar3];
        param_3[uVar3] = *pfVar1 * fVar4;
        *(ulong *)pfVar1 =
             CONCAT44(fVar4 * (float)((ulong)*(undefined8 *)pfVar1 >> 0x20),
                      fVar4 * (float)*(undefined8 *)pfVar1);
        if (all->normalized_updates == true) {
          pfVar1[all->normalized_idx] = fVar4 * pfVar1[all->normalized_idx];
        }
      }
      uVar3 = uVar3 + 1;
    } while (length != uVar3);
  }
  return;
}

Assistant:

void do_weighting(vw& all, uint64_t length, float* local_weights, T& weights)
{
  for (uint64_t i = 0; i < length; i++)
  {
    float* weight = &weights[i << weights.stride_shift()];
    if (local_weights[i] > 0)
    {
      float ratio = weight[1] / local_weights[i];
      local_weights[i] = weight[0] * ratio;
      weight[0] *= ratio;
      weight[1] *= ratio;  // A crude max
      if (all.normalized_updates)
        weight[all.normalized_idx] *= ratio;  // A crude max
    }
    else
    {
      local_weights[i] = 0;
      *weight = 0;
    }
  }
}